

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ConstantValue::convertToInt(ConstantValue *__return_storage_ptr__,ConstantValue *this)

{
  bool bVar1;
  int iVar2;
  bitwidth_t local_1c;
  bitwidth_t bits;
  ConstantValue *this_local;
  
  bVar1 = isReal(this);
  if (bVar1) {
    convertToInt(__return_storage_ptr__,this,0x40,true,false);
  }
  else {
    bVar1 = isShortReal(this);
    if (bVar1) {
      convertToInt(__return_storage_ptr__,this,0x20,true,false);
    }
    else {
      bVar1 = isString(this);
      if (bVar1) {
        str_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        local_1c = iVar2 << 3;
        if (local_1c == 0) {
          local_1c = 8;
        }
        convertToInt(__return_storage_ptr__,this,local_1c,false,false);
      }
      else {
        bVar1 = isInteger(this);
        if (bVar1) {
          ConstantValue(__return_storage_ptr__,this);
        }
        else {
          ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ConstantValue::convertToInt() const {
    if (isReal())
        return convertToInt(64, true, false);
    if (isShortReal())
        return convertToInt(32, true, false);
    if (isString()) {
        // TODO: overflow
        bitwidth_t bits = bitwidth_t(str().length() * 8);
        if (!bits)
            bits = 8;

        return convertToInt(bits, false, false);
    }
    if (!isInteger())
        return nullptr;

    return *this;
}